

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

bool __thiscall FString::IsInt(FString *this)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  bool bVar4;
  bool local_27;
  bool local_26;
  bool local_24;
  byte local_21;
  bool gothex;
  byte *pbStack_20;
  char yych;
  char *YYCURSOR;
  FString *this_local;
  
  local_21 = *this->Chars;
  pbStack_20 = (byte *)this->Chars;
  while( true ) {
    bVar4 = false;
    if (local_21 != 0) {
      iVar2 = isspace((uint)local_21);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    local_21 = pbStack_20[1];
    pbStack_20 = pbStack_20 + 1;
  }
  if ((local_21 == 0x2b) || (local_21 == 0x2d)) {
    local_21 = pbStack_20[1];
    pbStack_20 = pbStack_20 + 1;
  }
  if (local_21 == 0x30) {
    bVar1 = pbStack_20[1];
    if (((char)bVar1 < '0') || (pbVar3 = pbStack_20 + 1, '7' < (char)bVar1)) {
      if ((bVar1 != 0x58) && (bVar1 != 0x78)) {
        return false;
      }
      bVar4 = false;
      local_21 = pbStack_20[2];
      pbStack_20 = pbStack_20 + 2;
      while( true ) {
        if ((((char)local_21 < '0') || (local_26 = true, '9' < (char)local_21)) &&
           (((char)local_21 < 'A' || (local_26 = true, 'F' < (char)local_21)))) {
          local_26 = '`' < (char)local_21 && (char)local_21 < 'g';
        }
        if (!local_26) break;
        bVar4 = true;
        local_21 = pbStack_20[1];
        pbStack_20 = pbStack_20 + 1;
      }
      if (!bVar4) {
        return false;
      }
    }
    else {
      do {
        pbStack_20 = pbVar3;
        pbVar3 = pbStack_20 + 1;
        local_21 = pbStack_20[1];
        local_24 = '/' < (char)local_21 && (char)local_21 < '8';
        pbStack_20 = pbVar3;
      } while (local_24);
    }
  }
  else {
    if (((char)local_21 < '1') || ('9' < (char)local_21)) {
      return false;
    }
    do {
      pbVar3 = pbStack_20 + 1;
      local_21 = pbStack_20[1];
      local_27 = '/' < (char)local_21 && (char)local_21 < ':';
      pbStack_20 = pbVar3;
    } while (local_27);
  }
  while( true ) {
    bVar4 = false;
    if (local_21 != 0) {
      iVar2 = isspace((uint)local_21);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    local_21 = pbStack_20[1];
    pbStack_20 = pbStack_20 + 1;
  }
  return local_21 == 0;
}

Assistant:

bool FString::IsInt () const
{
	// String must match: [whitespace] [{+ | �}] [0 [{ x | X }]] [digits] [whitespace]

/* This state machine is based on a simplification of re2c's output for this input:
digits		= [0-9];
hexdigits	= [0-9a-fA-F];
octdigits	= [0-7];

("0" octdigits+ | "0" [xX] hexdigits+ | (digits \ '0') digits*) { return true; }
[\000-\377] { return false; }*/
	const char *YYCURSOR = Chars;
	char yych;

	yych = *YYCURSOR;

	// Skip preceding whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }

	// Check for sign
	if (yych == '+' || yych == '-') { yych = *++YYCURSOR; }

	if (yych == '0')
	{
		yych = *++YYCURSOR;
		if (yych >= '0' && yych <= '7')
		{
			do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '7');
		}
		else if (yych == 'X' || yych == 'x')
		{
			bool gothex = false;
			yych = *++YYCURSOR;
			while ((yych >= '0' && yych <= '9') || (yych >= 'A' && yych <= 'F') || (yych >= 'a' && yych <= 'f'))
			{
				gothex = true;
				yych = *++YYCURSOR;
			}
			if (!gothex) return false;
		}
		else
		{
			return false;
		}
	}
	else if (yych >= '1' && yych <= '9')
	{
		do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '9');
	}
	else
	{
		return false;
	}

	// The rest should all be whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }
	return yych == '\0';
}